

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O2

int private_connect(SOCKET sockfd,sockaddr *serv_addr,socklen_t addrlen)

{
  uint __i;
  int iVar1;
  long lVar2;
  int *piVar3;
  int valopt;
  socklen_t local_bc;
  timeval tmvTimeout;
  fd_set fdSet;
  
  iVar1 = sock_make_no_blocking(sockfd);
  if (iVar1 == -1) {
    return -1;
  }
  iVar1 = connect(sockfd,(sockaddr *)serv_addr,addrlen);
  tmvTimeout.tv_sec = 5;
  tmvTimeout.tv_usec = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fdSet.__fds_bits[lVar2] = 0;
  }
  fdSet.__fds_bits[sockfd / 0x40] = fdSet.__fds_bits[sockfd / 0x40] | 1L << ((byte)sockfd & 0x3f);
  if ((iVar1 < 0) && (piVar3 = __errno_location(), *piVar3 == 0x73)) {
    iVar1 = select(sockfd + 1,(fd_set *)0x0,(fd_set *)&fdSet,(fd_set *)0x0,(timeval *)&tmvTimeout);
    if (iVar1 < 1) {
      return -1;
    }
    valopt = 0;
    local_bc = 4;
    iVar1 = getsockopt(sockfd,1,4,&valopt,&local_bc);
    if (iVar1 < 0) {
      return -1;
    }
    if (valopt != 0) {
      return -1;
    }
  }
  iVar1 = sock_make_blocking(sockfd);
  return iVar1;
}

Assistant:

static int private_connect(
	SOCKET sockfd, const struct sockaddr *serv_addr, socklen_t addrlen)
{
#ifndef UPNP_ENABLE_BLOCKING_TCP_CONNECTIONS
	int ret = sock_make_no_blocking(sockfd);
	if (ret != -1) {
		ret = connect(sockfd, serv_addr, addrlen);
		ret = Check_Connect_And_Wait_Connection(sockfd, ret);
		if (ret != -1) {
			ret = sock_make_blocking(sockfd);
		}
	}

	return ret;
#else
	return connect(sockfd, serv_addr, addrlen);
#endif /* UPNP_ENABLE_BLOCKING_TCP_CONNECTIONS */
}